

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.cc
# Opt level: O3

MoveList * search::movegen::generateAll(MoveList *__return_storage_ptr__,Board *pos,bool onlyCaps)

{
  int (*paiVar1) [120];
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  undefined4 uVar7;
  undefined7 in_register_00000011;
  ulong uVar8;
  long lVar9;
  iterator iVar10;
  int iVar11;
  uint uVar12;
  int (*paiVar13) [10];
  int i_1;
  int iVar14;
  long lVar15;
  long lVar16;
  int *piVar17;
  int i;
  Move local_98;
  vector<board::Move,std::allocator<board::Move>> *local_90;
  int (*local_88) [10];
  Board *local_80;
  undefined4 local_74;
  ulong local_70;
  int (*local_68) [10];
  int (*local_60) [10];
  ulong local_58;
  int (*local_50) [120];
  int (*local_48) [120];
  ulong local_40;
  int (*local_38) [10];
  
  local_74 = (undefined4)CONCAT71(in_register_00000011,onlyCaps);
  (__return_storage_ptr__->moves).super__Vector_base<board::Move,_std::allocator<board::Move>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->moves).super__Vector_base<board::Move,_std::allocator<board::Move>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->moves).super__Vector_base<board::Move,_std::allocator<board::Move>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar11 = pos->side;
  paiVar13 = (int (*) [10])0x7;
  if (iVar11 == 0) {
    paiVar13 = (int (*) [10])0x1;
  }
  local_90 = (vector<board::Move,std::allocator<board::Move>> *)__return_storage_ptr__;
  local_80 = pos;
  if (0 < pos->pNum[(long)paiVar13]) {
    local_50 = (int (*) [120])0x0;
    uVar3 = -(uint)(iVar11 != 0) | 1;
    local_68 = pos->pList + (long)paiVar13;
    local_40 = (ulong)(uVar3 * 10);
    local_60 = (int (*) [10])(ulong)(uVar3 * 0x14);
    local_48 = pos->searchHistory;
    local_70 = (ulong)(uVar3 * 9);
    local_58 = (ulong)(uVar3 * 0xb);
    local_38 = paiVar13;
    do {
      uVar3 = (*local_68)[(long)local_50];
      local_88 = (int (*) [10])(ulong)uVar3;
      if (((char)local_74 == '\0') && (iVar11 = uVar3 + (int)local_40, pos->board[iVar11] == 0)) {
        iVar14 = pos->side;
        iVar5 = board::Board::RANKS[board::Board::SQ64[(int)uVar3]];
        uVar12 = iVar11 * 0x80;
        if (iVar5 == *(int *)((long)&PAWN_RANK + (long)iVar14 * 4)) {
          uVar12 = uVar12 | uVar3;
          lVar15 = 0;
          do {
            local_98.value =
                 *(int *)(PROMOTION_PIECES + (long)iVar14 * 0x10 + lVar15 * 4) << 0x14 | uVar12;
            local_98.score =
                 *(int *)(MVVLVA_SCORES +
                         (long)local_80->board[uVar3 & 0x7f] * 4 +
                         (ulong)((uVar12 & 0x3c000) >> 0xe) * 0x34) + 1000000;
            iVar10._M_current = *(Move **)((long)__return_storage_ptr__ + 8);
            if (iVar10._M_current == *(Move **)((long)__return_storage_ptr__ + 0x10)) {
              std::vector<board::Move,std::allocator<board::Move>>::
              _M_realloc_insert<board::Move_const&>
                        ((vector<board::Move,std::allocator<board::Move>> *)__return_storage_ptr__,
                         iVar10,&local_98);
            }
            else {
              *iVar10._M_current = local_98;
              *(long *)((long)__return_storage_ptr__ + 8) =
                   *(long *)((long)__return_storage_ptr__ + 8) + 8;
            }
            lVar15 = lVar15 + 1;
            __return_storage_ptr__ = (MoveList *)local_90;
          } while (lVar15 != 4);
        }
        else {
          local_98.value = uVar12 | uVar3;
          local_98.score =
               *(int *)(MVVLVA_SCORES +
                       (long)pos->board[uVar3 & 0x7f] * 4 +
                       (ulong)(local_98.value >> 0xe & 0xf) * 0x34) + 1000000;
          iVar10._M_current = *(Move **)((long)__return_storage_ptr__ + 8);
          if (iVar10._M_current == *(Move **)((long)__return_storage_ptr__ + 0x10)) {
            std::vector<board::Move,std::allocator<board::Move>>::
            _M_realloc_insert<board::Move_const&>
                      ((vector<board::Move,std::allocator<board::Move>> *)__return_storage_ptr__,
                       iVar10,&local_98);
          }
          else {
            *iVar10._M_current = local_98;
            *(long *)((long)__return_storage_ptr__ + 8) =
                 *(long *)((long)__return_storage_ptr__ + 8) + 8;
          }
        }
        __return_storage_ptr__ = (MoveList *)local_90;
        if (iVar5 == *(int *)((long)&PAWN_RANK + ((long)local_80->side ^ 1U) * 4)) {
          uVar12 = (uint)local_88;
          iVar11 = (int)local_60 + uVar12;
          if (local_80->board[iVar11] == 0) {
            uVar4 = iVar11 * 0x80 | uVar12;
            uVar6 = uVar4 | 0x80000;
            uVar8 = 0xdbba000000000;
            if ((local_80->searchKillers[0][local_80->ply] != uVar6) &&
               (uVar8 = 0xc350000000000, local_80->searchKillers[1][local_80->ply] != uVar6)) {
              uVar8 = (ulong)*(uint *)((long)local_48[local_80->board[uVar12 & 0x7f]] +
                                      (ulong)(uVar4 >> 5 & 0x1fc)) << 0x20;
            }
            local_98 = (Move)(uVar6 | uVar8);
            iVar10._M_current = *(Move **)(local_90 + 8);
            if (iVar10._M_current == *(Move **)(local_90 + 0x10)) {
              std::vector<board::Move,std::allocator<board::Move>>::
              _M_realloc_insert<board::Move_const&>(local_90,iVar10,&local_98);
              __return_storage_ptr__ = (MoveList *)local_90;
            }
            else {
              *iVar10._M_current = local_98;
              *(long *)(local_90 + 8) = *(long *)(local_90 + 8) + 8;
            }
          }
        }
      }
      iVar11 = uVar3 + (int)local_70;
      if (board::Board::SQ64[iVar11] != 99) {
        uVar12 = local_80->side;
        if ((board::Board::PIECE_COLOR[local_80->board[iVar11]] ^ uVar12) == 1) {
          uVar6 = local_80->board[iVar11] << 0xe | iVar11 * 0x80;
          uVar4 = (uint)local_88;
          if (board::Board::RANKS[board::Board::SQ64[(int)uVar3]] ==
              *(int *)((long)&PAWN_RANK + (long)(int)uVar12 * 4)) {
            uVar6 = uVar6 | uVar4;
            lVar15 = 0;
            do {
              local_98.value =
                   *(int *)(PROMOTION_PIECES + lVar15 * 4 + (long)(int)uVar12 * 0x10) << 0x14 |
                   uVar6;
              local_98.score =
                   *(int *)(MVVLVA_SCORES +
                           (long)local_80->board[uVar4 & 0x7f] * 4 +
                           (ulong)((uVar6 & 0x3c000) >> 0xe) * 0x34) + 1000000;
              iVar10._M_current = *(Move **)((long)__return_storage_ptr__ + 8);
              if (iVar10._M_current == *(Move **)((long)__return_storage_ptr__ + 0x10)) {
                std::vector<board::Move,std::allocator<board::Move>>::
                _M_realloc_insert<board::Move_const&>
                          ((vector<board::Move,std::allocator<board::Move>> *)__return_storage_ptr__
                           ,iVar10,&local_98);
              }
              else {
                *iVar10._M_current = local_98;
                *(long *)((long)__return_storage_ptr__ + 8) =
                     *(long *)((long)__return_storage_ptr__ + 8) + 8;
              }
              lVar15 = lVar15 + 1;
              __return_storage_ptr__ = (MoveList *)local_90;
            } while (lVar15 != 4);
          }
          else {
            local_98.value = uVar6 | uVar4;
            local_98.score =
                 *(int *)(MVVLVA_SCORES +
                         (long)local_80->board[uVar4 & 0x7f] * 4 +
                         (ulong)(local_98.value >> 0xe & 0xf) * 0x34) + 1000000;
            iVar10._M_current = *(Move **)((long)__return_storage_ptr__ + 8);
            if (iVar10._M_current == *(Move **)((long)__return_storage_ptr__ + 0x10)) {
              std::vector<board::Move,std::allocator<board::Move>>::
              _M_realloc_insert<board::Move_const&>
                        ((vector<board::Move,std::allocator<board::Move>> *)__return_storage_ptr__,
                         iVar10,&local_98);
              __return_storage_ptr__ = (MoveList *)local_90;
            }
            else {
              *iVar10._M_current = local_98;
              *(long *)((long)__return_storage_ptr__ + 8) =
                   *(long *)((long)__return_storage_ptr__ + 8) + 8;
              __return_storage_ptr__ = (MoveList *)local_90;
            }
          }
        }
      }
      iVar14 = (int)local_58 + uVar3;
      if (board::Board::SQ64[iVar14] != 99) {
        uVar12 = local_80->side;
        if ((board::Board::PIECE_COLOR[local_80->board[iVar14]] ^ uVar12) == 1) {
          uVar4 = local_80->board[iVar14] << 0xe | iVar14 * 0x80;
          uVar6 = (uint)local_88;
          if (board::Board::RANKS[board::Board::SQ64[(int)uVar3]] ==
              *(int *)((long)&PAWN_RANK + (long)(int)uVar12 * 4)) {
            uVar4 = uVar6 | uVar4;
            lVar15 = 0;
            do {
              local_98.value =
                   *(int *)(PROMOTION_PIECES + (long)(int)uVar12 * 0x10 + lVar15 * 4) << 0x14 |
                   uVar4;
              local_98.score =
                   *(int *)(MVVLVA_SCORES +
                           (long)local_80->board[uVar6 & 0x7f] * 4 +
                           (ulong)((uVar4 & 0x3c000) >> 0xe) * 0x34) + 1000000;
              iVar10._M_current = *(Move **)((long)__return_storage_ptr__ + 8);
              if (iVar10._M_current == *(Move **)((long)__return_storage_ptr__ + 0x10)) {
                std::vector<board::Move,std::allocator<board::Move>>::
                _M_realloc_insert<board::Move_const&>
                          ((vector<board::Move,std::allocator<board::Move>> *)__return_storage_ptr__
                           ,iVar10,&local_98);
              }
              else {
                *iVar10._M_current = local_98;
                *(long *)((long)__return_storage_ptr__ + 8) =
                     *(long *)((long)__return_storage_ptr__ + 8) + 8;
              }
              lVar15 = lVar15 + 1;
              __return_storage_ptr__ = (MoveList *)local_90;
            } while (lVar15 != 4);
          }
          else {
            local_98.value = uVar4 | uVar6;
            local_98.score =
                 *(int *)(MVVLVA_SCORES +
                         (long)local_80->board[uVar6 & 0x7f] * 4 +
                         (ulong)(local_98.value >> 0xe & 0xf) * 0x34) + 1000000;
            iVar10._M_current = *(Move **)((long)__return_storage_ptr__ + 8);
            if (iVar10._M_current == *(Move **)((long)__return_storage_ptr__ + 0x10)) {
              std::vector<board::Move,std::allocator<board::Move>>::
              _M_realloc_insert<board::Move_const&>
                        ((vector<board::Move,std::allocator<board::Move>> *)__return_storage_ptr__,
                         iVar10,&local_98);
              __return_storage_ptr__ = (MoveList *)local_90;
            }
            else {
              *iVar10._M_current = local_98;
              *(long *)((long)__return_storage_ptr__ + 8) =
                   *(long *)((long)__return_storage_ptr__ + 8) + 8;
              __return_storage_ptr__ = (MoveList *)local_90;
            }
          }
        }
      }
      paiVar13 = local_38;
      paiVar1 = local_50;
      pos = local_80;
      iVar5 = local_80->enPas;
      if (iVar5 != 99) {
        if (iVar11 == iVar5) {
          local_98 = (Move)(CONCAT44(MVVLVA_SCORES._56_4_ + 1000000,iVar11 * 0x80 | (uint)local_88)
                           | 0x40000);
          iVar10._M_current = *(Move **)((long)__return_storage_ptr__ + 8);
          if (iVar10._M_current == *(Move **)((long)__return_storage_ptr__ + 0x10)) {
            std::vector<board::Move,std::allocator<board::Move>>::
            _M_realloc_insert<board::Move_const&>
                      ((vector<board::Move,std::allocator<board::Move>> *)__return_storage_ptr__,
                       iVar10,&local_98);
          }
          else {
            *iVar10._M_current = local_98;
            *(long *)((long)__return_storage_ptr__ + 8) =
                 *(long *)((long)__return_storage_ptr__ + 8) + 8;
          }
          iVar5 = pos->enPas;
          __return_storage_ptr__ = (MoveList *)local_90;
        }
        if (iVar14 == iVar5) {
          local_98 = (Move)(CONCAT44(MVVLVA_SCORES._56_4_ + 1000000,iVar14 * 0x80 | (uint)local_88)
                           | 0x40000);
          iVar10._M_current = *(Move **)((long)__return_storage_ptr__ + 8);
          if (iVar10._M_current == *(Move **)((long)__return_storage_ptr__ + 0x10)) {
            std::vector<board::Move,std::allocator<board::Move>>::
            _M_realloc_insert<board::Move_const&>
                      ((vector<board::Move,std::allocator<board::Move>> *)__return_storage_ptr__,
                       iVar10,&local_98);
            __return_storage_ptr__ = (MoveList *)local_90;
          }
          else {
            *iVar10._M_current = local_98;
            *(long *)((long)__return_storage_ptr__ + 8) =
                 *(long *)((long)__return_storage_ptr__ + 8) + 8;
            __return_storage_ptr__ = (MoveList *)local_90;
          }
        }
      }
      local_50 = (int (*) [120])((long)paiVar1 + 1);
    } while ((long)local_50 < (long)pos->pNum[(long)paiVar13]);
    iVar11 = pos->side;
  }
  local_48 = (int (*) [120])((ulong)(iVar11 != 0) * 3);
  local_60 = pos->pList;
  local_50 = pos->searchHistory;
  lVar15 = 0;
  do {
    local_58 = (ulong)*(int *)(SLIDERS + ((long)local_48 + lVar15) * 4);
    local_40 = lVar15;
    if (0 < pos->pNum[local_58]) {
      local_38 = local_60 + local_58;
      local_68 = (int (*) [10])(local_58 << 5);
      local_70 = 0;
      do {
        uVar3 = (*local_38)[local_70];
        local_88 = (int (*) [10])(ulong)(uVar3 & 0x7f);
        lVar15 = 0;
        do {
          iVar11 = *(int *)((long)board::Board::MOVE_DIR[0] + (long)(*local_68 + lVar15));
          lVar9 = (long)iVar11;
          if (lVar9 == 0) break;
          uVar12 = (uVar3 + iVar11) * 0x80;
          piVar17 = pos->board + (int)uVar3 + lVar9;
          while( true ) {
            pos = local_80;
            iVar14 = *piVar17;
            if ((long)iVar14 != 0) break;
            if ((char)local_74 == '\0') {
              uVar4 = uVar12 | uVar3;
              uVar8 = 0xdbba000000000;
              if ((local_80->searchKillers[0][local_80->ply] != uVar4) &&
                 (uVar8 = 0xc350000000000, local_80->searchKillers[1][local_80->ply] != uVar4)) {
                uVar8 = (ulong)*(uint *)((long)local_50[local_80->board[(long)local_88]] +
                                        (ulong)(uVar4 >> 5 & 0x1fc)) << 0x20;
              }
              local_98 = (Move)(uVar4 | uVar8);
              iVar10._M_current = *(Move **)((long)__return_storage_ptr__ + 8);
              if (iVar10._M_current == *(Move **)((long)__return_storage_ptr__ + 0x10)) {
                std::vector<board::Move,std::allocator<board::Move>>::
                _M_realloc_insert<board::Move_const&>
                          ((vector<board::Move,std::allocator<board::Move>> *)__return_storage_ptr__
                           ,iVar10,&local_98);
                __return_storage_ptr__ = (MoveList *)local_90;
              }
              else {
                *iVar10._M_current = local_98;
                *(long *)((long)__return_storage_ptr__ + 8) =
                     *(long *)((long)__return_storage_ptr__ + 8) + 8;
                __return_storage_ptr__ = (MoveList *)local_90;
              }
            }
            uVar12 = uVar12 + iVar11 * 0x80;
            piVar17 = piVar17 + lVar9;
          }
          if ((iVar14 != 99) && ((local_80->side ^ board::Board::PIECE_COLOR[iVar14]) == 1)) {
            local_98.value = uVar12 | uVar3 | iVar14 << 0xe;
            local_98.score =
                 *(int *)(MVVLVA_SCORES +
                         (long)local_80->board[(long)local_88] * 4 +
                         (ulong)(local_98.value >> 0xe & 0xf) * 0x34) + 1000000;
            iVar10._M_current = *(Move **)((long)__return_storage_ptr__ + 8);
            if (iVar10._M_current == *(Move **)((long)__return_storage_ptr__ + 0x10)) {
              std::vector<board::Move,std::allocator<board::Move>>::
              _M_realloc_insert<board::Move_const&>
                        ((vector<board::Move,std::allocator<board::Move>> *)__return_storage_ptr__,
                         iVar10,&local_98);
              __return_storage_ptr__ = (MoveList *)local_90;
            }
            else {
              *iVar10._M_current = local_98;
              *(long *)((long)__return_storage_ptr__ + 8) =
                   *(long *)((long)__return_storage_ptr__ + 8) + 8;
              __return_storage_ptr__ = (MoveList *)local_90;
            }
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 8);
        local_70 = local_70 + 1;
      } while ((long)local_70 < (long)pos->pNum[local_58]);
    }
    lVar15 = local_40 + 1;
  } while (lVar15 != 3);
  local_70 = (ulong)((uint)(pos->side != 0) * 2);
  uVar7 = 1;
  uVar8 = 0;
  do {
    local_68 = (int (*) [10])CONCAT44(local_68._4_4_,uVar7);
    lVar15 = (long)*(int *)(NON_SLIDERS + (uVar8 | local_70) * 4);
    local_80 = (Board *)lVar15;
    if (0 < pos->pNum[lVar15]) {
      local_88 = local_60 + lVar15;
      lVar9 = 0;
      do {
        uVar3 = (*local_88)[lVar9];
        lVar16 = 0;
        do {
          if (board::Board::MOVE_DIR[lVar15][lVar16] == 0) break;
          iVar14 = board::Board::MOVE_DIR[lVar15][lVar16] + uVar3;
          iVar11 = pos->board[iVar14];
          if ((long)iVar11 == 0) {
            if ((char)local_74 == '\0') {
              uVar12 = iVar14 * 0x80 | uVar3;
              uVar8 = 0xdbba000000000;
              if ((pos->searchKillers[0][pos->ply] != uVar12) &&
                 (uVar8 = 0xc350000000000, pos->searchKillers[1][pos->ply] != uVar12)) {
                uVar8 = (ulong)*(uint *)((long)local_50[pos->board[uVar3 & 0x7f]] +
                                        (ulong)(uVar12 >> 5 & 0x1fc)) << 0x20;
              }
              local_98 = (Move)(uVar12 | uVar8);
              iVar10._M_current = *(Move **)((long)__return_storage_ptr__ + 8);
              if (iVar10._M_current != *(Move **)((long)__return_storage_ptr__ + 0x10))
              goto LAB_00130682;
              std::vector<board::Move,std::allocator<board::Move>>::
              _M_realloc_insert<board::Move_const&>
                        ((vector<board::Move,std::allocator<board::Move>> *)__return_storage_ptr__,
                         iVar10,&local_98);
              __return_storage_ptr__ = (MoveList *)local_90;
            }
          }
          else if ((iVar11 != 99) && ((pos->side ^ board::Board::PIECE_COLOR[iVar11]) == 1)) {
            local_98.value = iVar14 * 0x80 | uVar3 | iVar11 << 0xe;
            local_98.score =
                 *(int *)(MVVLVA_SCORES +
                         (long)pos->board[uVar3 & 0x7f] * 4 +
                         (ulong)(local_98.value >> 0xe & 0xf) * 0x34) + 1000000;
            iVar10._M_current = *(Move **)((long)__return_storage_ptr__ + 8);
            if (iVar10._M_current == *(Move **)((long)__return_storage_ptr__ + 0x10)) {
              std::vector<board::Move,std::allocator<board::Move>>::
              _M_realloc_insert<board::Move_const&>
                        ((vector<board::Move,std::allocator<board::Move>> *)__return_storage_ptr__,
                         iVar10,&local_98);
              __return_storage_ptr__ = (MoveList *)local_90;
            }
            else {
LAB_00130682:
              *iVar10._M_current = local_98;
              *(long *)((long)__return_storage_ptr__ + 8) =
                   *(long *)((long)__return_storage_ptr__ + 8) + 8;
              __return_storage_ptr__ = (MoveList *)local_90;
            }
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != 8);
        lVar9 = lVar9 + 1;
      } while (lVar9 < pos->pNum[(long)local_80]);
    }
    uVar8 = 1;
    uVar7 = 0;
    if (((ulong)local_68 & 1) == 0) {
      if ((char)local_74 == '\0') {
        if (pos->side == 0) {
          if (((((pos->castlePerm & 1U) != 0) && (pos->board[0x1a] == 0)) && (pos->board[0x1b] == 0)
              ) && ((bVar2 = board::Board::sqAttacked(pos,0x19,1), !bVar2 &&
                    (bVar2 = board::Board::sqAttacked(pos,0x1a,1), !bVar2)))) {
            addQuietMove(0x1000d99,(MoveList *)local_90,pos);
          }
          if ((pos->castlePerm & 2) == 0) {
            return (MoveList *)local_90;
          }
          if (pos->board[0x18] != 0) {
            return (MoveList *)local_90;
          }
          if (pos->board[0x17] != 0) {
            return (MoveList *)local_90;
          }
          if (pos->board[0x16] != 0) {
            return (MoveList *)local_90;
          }
          bVar2 = board::Board::sqAttacked(pos,0x19,1);
          if (bVar2) {
            return (MoveList *)local_90;
          }
          bVar2 = board::Board::sqAttacked(pos,0x18,1);
          iVar11 = 0x1000b99;
        }
        else {
          if ((((pos->castlePerm & 4U) != 0) && (pos->board[0x60] == 0)) &&
             ((pos->board[0x61] == 0 &&
              ((bVar2 = board::Board::sqAttacked(pos,0x5f,0), !bVar2 &&
               (bVar2 = board::Board::sqAttacked(pos,0x60,0), !bVar2)))))) {
            addQuietMove(0x10030df,(MoveList *)local_90,pos);
          }
          if ((pos->castlePerm & 8) == 0) {
            return (MoveList *)local_90;
          }
          if (pos->board[0x5e] != 0) {
            return (MoveList *)local_90;
          }
          if (pos->board[0x5d] != 0) {
            return (MoveList *)local_90;
          }
          if (pos->board[0x5c] != 0) {
            return (MoveList *)local_90;
          }
          bVar2 = board::Board::sqAttacked(pos,0x5f,0);
          if (bVar2) {
            return (MoveList *)local_90;
          }
          bVar2 = board::Board::sqAttacked(pos,0x5e,0);
          iVar11 = 0x1002edf;
        }
        if (bVar2 == false) {
          addQuietMove(iVar11,(MoveList *)local_90,pos);
        }
      }
      return (MoveList *)local_90;
    }
  } while( true );
}

Assistant:

search::MoveList search::movegen::generateAll(board::Board& pos, const bool onlyCaps)
{
    MoveList moves;
    int square;
    int piece;
    int offset;
    int direction;
    int targetSquare;
    pos.getSide() == board::WHITE ? piece = board::WP : piece = board::BP;
    pos.getSide() == board::WHITE ? offset = 1 : offset = -1;
    for (int pceNum = 0; pceNum < pos.getPieceNum(piece); pceNum++) {
        square = pos.getPieceList(piece)[pceNum];
        if (!onlyCaps) {
            if (pos.getSquare(square + offset * 10) == board::EMPTY) {
                addPawnMove(square, square + offset * 10, board::EMPTY, pos.getSide(), moves, pos);
                if (board::Board::RANKS[board::Board::SQ64[square]] == PAWN_RANK[(pos.getSide() ^ 1)] &&
                    pos.getSquare(square + offset * 20) == board::EMPTY) {
                    addQuietMove(board::Move::MOVE(square, square + offset * 20, board::EMPTY, board::EMPTY,
                                                   board::Move::MFLAGPS),
                                 moves, pos);
                }
            }
        }
        if (board::Board::SQ64[square + offset * 9] != board::NO_SQ &&
            board::Board::PIECE_COLOR[pos.getSquare(square + offset * 9)] == (pos.getSide() ^ 1)) {
            addPawnMove(square, square + offset * 9, pos.getSquare(square + offset * 9), pos.getSide(), moves, pos);
        }
        if (board::Board::SQ64[square + offset * 11] != board::NO_SQ &&
            board::Board::PIECE_COLOR[pos.getSquare(square + offset * 11)] == (pos.getSide() ^ 1)) {
            addPawnMove(square, square + offset * 11, pos.getSquare(square + offset * 11), pos.getSide(), moves, pos);
        }
        if (pos.getEnPas() != board::NO_SQ) {
            if (square + offset * 9 == pos.getEnPas()) {
                addEnPasMove(
                    board::Move::MOVE(square, square + offset * 9, board::EMPTY, board::EMPTY, board::Move::MFLAGEP),
                    moves);
            }
            if (square + offset * 11 == pos.getEnPas()) {
                addEnPasMove(
                    board::Move::MOVE(square, square + offset * 11, board::EMPTY, board::EMPTY, board::Move::MFLAGEP),
                    moves);
            }
        }
    }
    pos.getSide() == board::WHITE ? offset = 0 : offset = 3;
    for (int index = 0; index < 3; index++) {
        piece = SLIDERS[index + offset];
        for (int pceNum = 0; pceNum < pos.getPieceNum(piece); pceNum++) {
            square = pos.getPieceList(piece)[pceNum];
            for (int i = 0; i < 8 && board::Board::MOVE_DIR[piece][i] != 0; i++) {
                direction = board::Board::MOVE_DIR[piece][i];
                targetSquare = square + direction;
                while (pos.getSquare(targetSquare) != board::NO_SQ) {
                    if (pos.getSquare(targetSquare) != board::EMPTY) {
                        if (board::Board::PIECE_COLOR[pos.getSquare(targetSquare)] == (pos.getSide() ^ 1)) {
                            addCaptureMove(
                                board::Move::MOVE(square, targetSquare, pos.getSquare(targetSquare), board::EMPTY, 0),
                                moves, pos);
                        }
                        break;
                    }
                    if (!onlyCaps) {
                        addQuietMove(board::Move::MOVE(square, targetSquare, board::EMPTY, board::EMPTY, 0), moves,
                                     pos);
                    }
                    targetSquare += direction;
                }
            }
        }
    }
    pos.getSide() == board::WHITE ? offset = 0 : offset = 2;
    for (int index = 0; index < 2; index++) {
        piece = NON_SLIDERS[index + offset];
        for (int pceNum = 0; pceNum < pos.getPieceNum(piece); pceNum++) {
            square = pos.getPieceList(piece)[pceNum];
            for (int i = 0; i < 8 && board::Board::MOVE_DIR[piece][i] != 0; i++) {
                direction = board::Board::MOVE_DIR[piece][i];
                targetSquare = square + direction;
                if (pos.getSquare(targetSquare) == board::NO_SQ) {
                    continue;
                }
                if (pos.getSquare(targetSquare) != board::EMPTY) {
                    if (board::Board::PIECE_COLOR[pos.getSquare(targetSquare)] == (pos.getSide() ^ 1)) {
                        addCaptureMove(
                            board::Move::MOVE(square, targetSquare, pos.getSquare(targetSquare), board::EMPTY, 0),
                            moves, pos);
                    }
                    continue;
                }
                if (!onlyCaps) {
                    addQuietMove(board::Move::MOVE(square, targetSquare, board::EMPTY, board::EMPTY, 0), moves, pos);
                }
            }
        }
    }
    if (!onlyCaps) {
        if (pos.getSide() == board::WHITE) {
            if (pos.getCastlePerm() & board::WKCA) {
                if (pos.getSquare(board::F1) == board::EMPTY && pos.getSquare(board::G1) == board::EMPTY) {
                    if (!pos.sqAttacked(board::E1, board::BLACK) && !pos.sqAttacked(board::F1, board::BLACK)) {
                        addQuietMove(
                            board::Move::MOVE(board::E1, board::G1, board::EMPTY, board::EMPTY, board::Move::MFLAGCA),
                            moves, pos);
                    }
                }
            }
            if (pos.getCastlePerm() & board::WQCA) {
                if (pos.getSquare(board::D1) == board::EMPTY && pos.getSquare(board::C1) == board::EMPTY &&
                    pos.getSquare(board::B1) == board::EMPTY) {
                    if (!pos.sqAttacked(board::E1, board::BLACK) && !pos.sqAttacked(board::D1, board::BLACK)) {
                        addQuietMove(
                            board::Move::MOVE(board::E1, board::C1, board::EMPTY, board::EMPTY, board::Move::MFLAGCA),
                            moves, pos);
                    }
                }
            }
        }
        else {
            if (pos.getCastlePerm() & board::BKCA) {
                if (pos.getSquare(board::F8) == board::EMPTY && pos.getSquare(board::G8) == board::EMPTY) {
                    if (!pos.sqAttacked(board::E8, board::WHITE) && !pos.sqAttacked(board::F8, board::WHITE)) {
                        addQuietMove(
                            board::Move::MOVE(board::E8, board::G8, board::EMPTY, board::EMPTY, board::Move::MFLAGCA),
                            moves, pos);
                    }
                }
            }
            if (pos.getCastlePerm() & board::BQCA) {
                if (pos.getSquare(board::D8) == board::EMPTY && pos.getSquare(board::C8) == board::EMPTY &&
                    pos.getSquare(board::B8) == board::EMPTY) {
                    if (!pos.sqAttacked(board::E8, board::WHITE) && !pos.sqAttacked(board::D8, board::WHITE)) {
                        addQuietMove(
                            board::Move::MOVE(board::E8, board::C8, board::EMPTY, board::EMPTY, board::Move::MFLAGCA),
                            moves, pos);
                    }
                }
            }
        }
    }
    return moves;
}